

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshFace::IsValid(ON_MeshFace *this,int mesh_vertex_count,ON_3dPoint *V)

{
  bool bVar1;
  ON_3dPoint *V_local;
  int mesh_vertex_count_local;
  ON_MeshFace *this_local;
  
  bVar1 = IsValid(this,mesh_vertex_count);
  if (bVar1) {
    bVar1 = ON_3dPoint::operator!=(V + this->vi[0],V + this->vi[1]);
    if (bVar1) {
      bVar1 = ON_3dPoint::operator!=(V + this->vi[0],V + this->vi[2]);
      if (bVar1) {
        bVar1 = ON_3dPoint::operator!=(V + this->vi[1],V + this->vi[2]);
        if (bVar1) {
          if (this->vi[2] != this->vi[3]) {
            bVar1 = ON_3dPoint::operator!=(V + this->vi[0],V + this->vi[3]);
            if (!bVar1) {
              return false;
            }
            bVar1 = ON_3dPoint::operator!=(V + this->vi[1],V + this->vi[3]);
            if (!bVar1) {
              return false;
            }
            bVar1 = ON_3dPoint::operator!=(V + this->vi[2],V + this->vi[3]);
            if (!bVar1) {
              return false;
            }
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_MeshFace::IsValid(int mesh_vertex_count, const ON_3dPoint* V ) const
{
  if ( !IsValid(mesh_vertex_count) )
    return false;
  if ( !(V[vi[0]] != V[vi[1]]) )
    return false;
  if ( !(V[vi[0]] != V[vi[2]]) )
    return false;
  if ( !(V[vi[1]] != V[vi[2]]) )
    return false;
  if ( vi[2] != vi[3] )
  {
  if ( !(V[vi[0]] != V[vi[3]]) )
    return false;
  if ( !(V[vi[1]] != V[vi[3]]) )
    return false;
  if ( !(V[vi[2]] != V[vi[3]]) )
    return false;
  }
  return true;
}